

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O2

void FAudio_OPERATIONSET_QueueSetFrequencyRatio
               (FAudioSourceVoice *voice,float Ratio,uint32_t OperationSet)

{
  FAudio_OPERATIONSET_Operation *pFVar1;
  
  FAudio_PlatformLockMutex(voice->audio->operationLock);
  pFVar1 = QueueOperation(voice,FAUDIOOP_SETFREQUENCYRATIO,OperationSet);
  (pFVar1->Data).EnableEffect.EffectIndex = (uint32_t)Ratio;
  FAudio_PlatformUnlockMutex(voice->audio->operationLock);
  return;
}

Assistant:

void FAudio_OPERATIONSET_QueueSetFrequencyRatio(
	FAudioSourceVoice *voice,
	float Ratio,
	uint32_t OperationSet
) {
	FAudio_OPERATIONSET_Operation *op;

	FAudio_PlatformLockMutex(voice->audio->operationLock);
	LOG_MUTEX_LOCK(voice->audio, voice->audio->operationLock)

	op = QueueOperation(
		voice,
		FAUDIOOP_SETFREQUENCYRATIO,
		OperationSet
	);

	op->Data.SetFrequencyRatio.Ratio = Ratio;

	FAudio_PlatformUnlockMutex(voice->audio->operationLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->audio->operationLock)
}